

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbAbc.c
# Opt level: O2

Acb_Ntk_t * Acb_NtkFromAbc(Abc_Ntk_t *p)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  Acb_Man_t *p_00;
  Acb_Ntk_t *p_01;
  Abc_Obj_t *pAVar4;
  word x;
  Abc_Nam_t *in_RCX;
  ulong uVar5;
  Abc_Nam_t *in_RDX;
  Acb_ObjType_t Type;
  char *__assertion;
  Abc_Nam_t *in_R8;
  Hash_IntMan_t *in_R9;
  long lVar6;
  
  p_00 = Acb_ManAlloc(p->pSpec,0,in_RDX,in_RCX,in_R8,in_R9);
  iVar1 = Abc_NamStrFindOrAdd(p_00->pStrs,p->pName,(int *)0x0);
  uVar2 = p->vCos->nSize;
  uVar5 = (ulong)uVar2;
  p_01 = Acb_NtkAlloc(p_00,iVar1,p->vCis->nSize,uVar2,p->vObjs->nSize + -1);
  if ((p->ntkFunc == ABC_FUNC_SOP) && (p->ntkType == ABC_NTK_LOGIC)) {
    p_01->nFaninMax = 6;
    iVar1 = 1;
    do {
      iVar3 = p->vObjs->nSize;
      if (iVar3 <= iVar1) {
        for (iVar1 = 0; iVar1 < iVar3; iVar1 = iVar1 + 1) {
          pAVar4 = Abc_NtkObj(p,iVar1);
          if ((pAVar4 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar4->field_0x14 & 0xf) == 7)) {
            for (lVar6 = 0; lVar6 < (pAVar4->vFanins).nSize; lVar6 = lVar6 + 1) {
              Acb_ObjAddFanin(p_01,(pAVar4->field_6).iTemp,
                              *(int *)((long)pAVar4->pNtk->vObjs->pArray
                                             [(pAVar4->vFanins).pArray[lVar6]] + 0x40));
            }
          }
          iVar3 = p->vObjs->nSize;
        }
        for (iVar1 = 0; iVar1 < p->vCos->nSize; iVar1 = iVar1 + 1) {
          pAVar4 = Abc_NtkCo(p,iVar1);
          Acb_ObjAddFanin(p_01,(pAVar4->field_6).iTemp,
                          *(int *)((long)pAVar4->pNtk->vObjs->pArray[*(pAVar4->vFanins).pArray] +
                                  0x40));
        }
        Acb_NtkCleanObjTruths(p_01);
        for (iVar1 = 0; iVar1 < p->vObjs->nSize; iVar1 = iVar1 + 1) {
          pAVar4 = Abc_NtkObj(p,iVar1);
          if ((pAVar4 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar4->field_0x14 & 0xf) == 7)) {
            iVar3 = (pAVar4->field_6).iTemp;
            x = Abc_SopToTruth((char *)(pAVar4->field_5).pData,(pAVar4->vFanins).nSize);
            Acb_ObjSetTruth(p_01,iVar3,x);
          }
        }
        p_01->nRegs = p->nObjCounts[8];
        Acb_NtkAdd(p_00,p_01);
        return p_01;
      }
      pAVar4 = Abc_NtkObj(p,iVar1);
      if (pAVar4 == (Abc_Obj_t *)0x0) {
        Acb_ObjAlloc(p_01,ABC_OPER_NONE,0,(int)uVar5);
      }
      else {
        uVar2 = *(uint *)&pAVar4->field_0x14 & 0xf;
        if ((uVar2 == 5) || (uVar2 == 2)) {
          Type = ABC_OPER_CI;
          iVar3 = 0;
        }
        else {
          uVar5 = (ulong)(uVar2 - 5);
          if (uVar2 - 5 < 0xfffffffe) {
            if (uVar2 != 7) {
              __assertion = "0";
              uVar2 = 0x5c;
              goto LAB_00323611;
            }
            Type = ABC_OPER_LUT;
            iVar3 = (pAVar4->vFanins).nSize;
          }
          else {
            Type = ABC_OPER_CO;
            iVar3 = 1;
          }
        }
        iVar3 = Acb_ObjAlloc(p_01,Type,iVar3,(int)uVar5);
        (pAVar4->field_6).iTemp = iVar3;
        if (iVar3 != pAVar4->Id) {
          __assertion = "pObj == NULL || pObj->iTemp == (int)Abc_ObjId(pObj)";
          uVar2 = 0x5d;
          goto LAB_00323611;
        }
      }
      iVar1 = iVar1 + 1;
    } while( true );
  }
  __assertion = "Abc_NtkIsSopLogic(p)";
  uVar2 = 0x4f;
LAB_00323611:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acbAbc.c"
                ,uVar2,"Acb_Ntk_t *Acb_NtkFromAbc(Abc_Ntk_t *)");
}

Assistant:

Acb_Ntk_t * Acb_NtkFromAbc( Abc_Ntk_t * p )
{
    Acb_Man_t * pMan = Acb_ManAlloc( Abc_NtkSpec(p), 1, NULL, NULL, NULL, NULL );
    int i, k, NameId = Abc_NamStrFindOrAdd( pMan->pStrs, Abc_NtkName(p), NULL );
    Acb_Ntk_t * pNtk = Acb_NtkAlloc( pMan, NameId, Abc_NtkCiNum(p), Abc_NtkCoNum(p), Abc_NtkObjNumMax(p)-1 );
    Abc_Obj_t * pObj, * pFanin;
    assert( Abc_NtkIsSopLogic(p) );
    pNtk->nFaninMax = 6;
    for ( i = 1; i < Abc_NtkObjNumMax(p); i++ )
    {
        pObj = Abc_NtkObj( p, i );
        if ( pObj == NULL )
            Acb_ObjAlloc( pNtk, ABC_OPER_NONE, 0, 0 );
        else if ( Abc_ObjIsCi(pObj) )
            pObj->iTemp = Acb_ObjAlloc( pNtk, ABC_OPER_CI, 0, 0 );
        else if ( Abc_ObjIsCo(pObj) )
            pObj->iTemp = Acb_ObjAlloc( pNtk, ABC_OPER_CO, 1, 0 );
        else if ( Abc_ObjIsNode(pObj) )
            pObj->iTemp = Acb_ObjAlloc( pNtk, ABC_OPER_LUT, Abc_ObjFaninNum(pObj), 0 );
        else assert( 0 );
        assert( pObj == NULL || pObj->iTemp == (int)Abc_ObjId(pObj) );
    }
    Abc_NtkForEachNode( p, pObj, i )
        Abc_ObjForEachFanin( pObj, pFanin, k )
            Acb_ObjAddFanin( pNtk, pObj->iTemp, pFanin->iTemp );
    Abc_NtkForEachCo( p, pObj, i )
        Acb_ObjAddFanin( pNtk, pObj->iTemp, Abc_ObjFanin(pObj, 0)->iTemp );
    Acb_NtkCleanObjTruths( pNtk );
    Abc_NtkForEachNode( p, pObj, i )
        Acb_ObjSetTruth( pNtk, pObj->iTemp, Abc_SopToTruth((char *)pObj->pData, Abc_ObjFaninNum(pObj)) );
    Acb_NtkSetRegNum( pNtk, Abc_NtkLatchNum(p) );
    Acb_NtkAdd( pMan, pNtk );
    return pNtk;
}